

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  secp256k1_fe *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  uint64_t uVar260;
  uint64_t uVar261;
  uint64_t uVar262;
  uint64_t uVar263;
  int iVar264;
  int iVar265;
  uint uVar266;
  undefined8 uVar267;
  ulong uVar268;
  secp256k1_ge *in_RCX;
  uchar *tag;
  ulong uVar269;
  ulong uVar270;
  uint flag;
  long lVar271;
  ulong uVar272;
  secp256k1_gej *a_00;
  secp256k1_fe *out32;
  secp256k1_gej *psVar273;
  ulong uVar274;
  ulong uVar275;
  secp256k1_fe *psVar276;
  secp256k1_ge *in_R8;
  ulong uVar277;
  size_t in_R9;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar278;
  secp256k1_gej *psVar279;
  secp256k1_ge *unaff_R13;
  secp256k1_ge *psVar280;
  secp256k1_ge *psVar281;
  secp256k1_gej *unaff_R15;
  bool bVar282;
  bool bVar283;
  uint64_t tmp3_2;
  uint64_t tmp2_2;
  uint64_t tmp3_3;
  uint64_t tmp3_1;
  secp256k1_fe u2;
  secp256k1_fe n;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe tt;
  secp256k1_fe s2;
  secp256k1_fe zz;
  secp256k1_sha256 sStack_448;
  secp256k1_gej *psStack_3e0;
  secp256k1_gej *psStack_3d8;
  secp256k1_fe *psStack_3d0;
  secp256k1_gej *psStack_3c8;
  secp256k1_fe *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  ulong uStack_3a8;
  ulong uStack_3a0;
  secp256k1_fe sStack_398;
  secp256k1_fe sStack_368;
  secp256k1_gej *psStack_338;
  secp256k1_gej *psStack_330;
  secp256k1_ge *psStack_328;
  secp256k1_gej *psStack_320;
  secp256k1_gej *psStack_318;
  secp256k1_gej *psStack_310;
  secp256k1_ge *local_308;
  secp256k1_gej *local_300;
  ulong local_2f8;
  secp256k1_gej *local_2f0;
  undefined1 local_2e8 [96];
  secp256k1_gej *local_288;
  ulong local_280;
  undefined1 local_278 [56];
  uint64_t uStack_240;
  uint64_t local_238;
  uint64_t uStack_230;
  secp256k1_ge *local_228;
  int local_220;
  undefined1 local_218 [104];
  uint64_t uStack_1b0;
  secp256k1_gej *local_1a8;
  secp256k1_ge *psStack_1a0;
  secp256k1_ge *local_198;
  ulong uStack_190;
  undefined1 local_188 [56];
  ulong uStack_150;
  ulong local_148;
  secp256k1_ge *psStack_140;
  secp256k1_gej *local_138;
  ulong uStack_130;
  undefined1 local_128 [56];
  uint64_t uStack_f0;
  uint64_t local_e8;
  uint64_t uStack_e0;
  uint64_t local_d8;
  int local_d0;
  secp256k1_gej local_c8;
  
  psStack_310 = (secp256k1_gej *)0x10aa4b;
  a_00 = a;
  secp256k1_gej_verify(a);
  psStack_310 = (secp256k1_gej *)0x10aa53;
  psVar273 = (secp256k1_gej *)b;
  secp256k1_ge_verify(b);
  local_308 = b;
  if (b->infinity == 0) {
    if (1 < (uint)a->infinity) goto LAB_0010c03a;
    psVar1 = &a->z;
    psStack_310 = (secp256k1_gej *)0x10aa7b;
    psVar273 = (secp256k1_gej *)psVar1;
    secp256k1_fe_verify(psVar1);
    b = (secp256k1_ge *)psVar1;
    if (8 < (a->z).magnitude) goto LAB_0010c03f;
    uVar270 = psVar1->n[0];
    uVar277 = (a->z).n[1];
    uVar272 = (a->z).n[2];
    uVar274 = (a->z).n[3];
    uVar275 = (a->z).n[4];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar270 * 2;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar274;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar277 * 2;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar272;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar275;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar275;
    uVar268 = SUB168(auVar4 * auVar124,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar268 & 0xfffffffffffff;
    auVar2 = auVar3 * auVar123 + auVar2 * auVar122 + auVar5 * ZEXT816(0x1000003d10);
    uVar269 = auVar2._0_8_;
    local_218._96_8_ = uVar269 & 0xfffffffffffff;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = uVar269 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar275 = uVar275 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar270;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar275;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar277 * 2;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar274;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar272;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar272;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar268 >> 0x34 | SUB168(auVar4 * auVar124,8) << 0xc;
    auVar2 = auVar6 * auVar125 + auVar218 + auVar7 * auVar126 + auVar8 * auVar127 +
             auVar9 * ZEXT816(0x1000003d10);
    local_278._48_8_ = auVar2._0_8_;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = (ulong)local_278._48_8_ >> 0x34 | auVar2._8_8_ << 0xc;
    local_218._48_8_ = (local_278._48_8_ & 0xfffffffffffff) >> 0x30;
    local_278._48_8_ = local_278._48_8_ & 0xffffffffffff;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar270;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar270;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar277;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar275;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar272 * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar274;
    auVar2 = auVar11 * auVar129 + auVar219 + auVar12 * auVar130;
    uVar268 = auVar2._0_8_;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = uVar268 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = (uVar268 & 0xfffffffffffff) << 4 | local_218._48_8_;
    auVar2 = auVar10 * auVar128 + ZEXT816(0x1000003d1) * auVar131;
    uVar268 = auVar2._0_8_;
    local_c8.z.n[1] = uVar268 & 0xfffffffffffff;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar268 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar270 * 2;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar277;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar272;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar275;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar274;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar274;
    auVar3 = auVar14 * auVar133 + auVar221 + auVar15 * auVar134;
    uVar268 = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar268 & 0xfffffffffffff;
    auVar2 = auVar13 * auVar132 + auVar220 + auVar16 * ZEXT816(0x1000003d10);
    uVar269 = auVar2._0_8_;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uVar268 >> 0x34 | auVar3._8_8_ << 0xc;
    local_c8.z.n[2] = uVar269 & 0xfffffffffffff;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = uVar269 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar270 * 2;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uVar272;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar277;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar277;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar274;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar275;
    auVar223 = auVar19 * auVar137 + auVar223;
    uVar270 = auVar223._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar17 * auVar135 + auVar222 + auVar18 * auVar136 + auVar20 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    local_c8.z.n[3] = uVar277 & 0xfffffffffffff;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = (uVar277 >> 0x34 | auVar2._8_8_ << 0xc) + local_218._96_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar270 >> 0x34 | auVar223._8_8_ << 0xc;
    auVar224 = auVar21 * ZEXT816(0x1000003d10) + auVar224;
    uVar270 = auVar224._0_8_;
    local_c8.z.n[4] = uVar270 & 0xfffffffffffff;
    local_c8.z._40_8_ = (uVar270 >> 0x34 | auVar224._8_8_ << 0xc) + local_278._48_8_;
    b = (secp256k1_ge *)0x1000003d1;
    local_c8.infinity = 1;
    local_c8._148_4_ = 0;
    psStack_310 = (secp256k1_gej *)0x10ad02;
    local_300 = (secp256k1_gej *)psVar1;
    local_288 = r;
    secp256k1_fe_verify((secp256k1_fe *)(local_c8.z.n + 1));
    local_218._96_8_ = (a->x).n[0];
    uStack_1b0 = (a->x).n[1];
    local_1a8 = (secp256k1_gej *)(a->x).n[2];
    psStack_1a0 = (secp256k1_ge *)(a->x).n[3];
    local_198 = (secp256k1_ge *)(a->x).n[4];
    uStack_190._0_4_ = (a->x).magnitude;
    uStack_190._4_4_ = (a->x).normalized;
    psStack_310 = (secp256k1_gej *)0x10ad29;
    secp256k1_fe_verify((secp256k1_fe *)(local_218 + 0x60));
    uVar270 = ((ulong)local_198 >> 0x30) * 0x1000003d1 + local_218._96_8_;
    uVar277 = (uVar270 >> 0x34) + uStack_1b0;
    uVar272 = (uVar277 >> 0x34) + (long)local_1a8;
    uVar274 = (uVar272 >> 0x34) + (long)psStack_1a0;
    psStack_1a0 = (secp256k1_ge *)(uVar274 & 0xfffffffffffff);
    local_198 = (secp256k1_ge *)((uVar274 >> 0x34) + ((ulong)local_198 & 0xffffffffffff));
    local_1a8 = (secp256k1_gej *)(uVar272 & 0xfffffffffffff);
    uStack_1b0 = uVar277 & 0xfffffffffffff;
    local_218._96_8_ = uVar270 & 0xfffffffffffff;
    uStack_190 = CONCAT44(uStack_190._4_4_,1);
    psStack_310 = (secp256k1_gej *)0x10ad9b;
    secp256k1_fe_verify((secp256k1_fe *)(local_218 + 0x60));
    unaff_R13 = local_308;
    psVar279 = (secp256k1_gej *)(local_278 + 0x30);
    psStack_310 = (secp256k1_gej *)0x10adba;
    secp256k1_fe_mul((secp256k1_fe *)psVar279,&local_308->x,(secp256k1_fe *)(local_c8.z.n + 1));
    local_218._48_8_ = (a->y).n[0];
    local_218._56_8_ = (a->y).n[1];
    local_218._64_8_ = (a->y).n[2];
    local_218._72_8_ = (a->y).n[3];
    local_218._80_8_ = (a->y).n[4];
    local_218._88_4_ = (a->y).magnitude;
    local_218._92_4_ = (a->y).normalized;
    psStack_310 = (secp256k1_gej *)0x10adec;
    local_2e8._88_8_ = a;
    secp256k1_fe_verify((secp256k1_fe *)(local_218 + 0x30));
    uVar270 = ((ulong)local_218._80_8_ >> 0x30) * 0x1000003d1 + local_218._48_8_;
    uVar277 = (uVar270 >> 0x34) + local_218._56_8_;
    uVar272 = (uVar277 >> 0x34) + local_218._64_8_;
    uVar274 = (uVar272 >> 0x34) + local_218._72_8_;
    in_R8 = (secp256k1_ge *)(uVar274 & 0xfffffffffffff);
    in_R9 = 0xffffffffffff;
    in_RCX = (secp256k1_ge *)(local_218._80_8_ & 0xffffffffffff);
    local_218._80_8_ = (long)(in_RCX->x).n + (uVar274 >> 0x34);
    local_218._64_8_ = uVar272 & 0xfffffffffffff;
    local_218._56_8_ = uVar277 & 0xfffffffffffff;
    local_218._48_8_ = uVar270 & 0xfffffffffffff;
    local_218._88_4_ = 1;
    psStack_310 = (secp256k1_gej *)0x10ae66;
    local_218._72_8_ = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)(local_218 + 0x30));
    unaff_R12 = (secp256k1_gej *)&unaff_R13->y;
    unaff_R15 = (secp256k1_gej *)(local_128 + 0x30);
    psStack_310 = (secp256k1_gej *)0x10ae85;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R15,(secp256k1_fe *)unaff_R12,
                     (secp256k1_fe *)(local_c8.z.n + 1));
    psStack_310 = (secp256k1_gej *)0x10ae95;
    a_00 = unaff_R15;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R15,(secp256k1_fe *)unaff_R15,&local_300->x);
    r = (secp256k1_gej *)local_2e8;
    local_2e8._32_8_ = local_198;
    local_2e8._40_8_ = uStack_190;
    local_2e8._16_8_ = local_1a8;
    local_2e8._24_8_ = psStack_1a0;
    local_2e8._0_8_ = local_218._96_8_;
    local_2e8._8_8_ = uStack_1b0;
    psStack_310 = (secp256k1_gej *)0x10aeb8;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psStack_310 = (secp256k1_gej *)0x10aec0;
    psVar273 = psVar279;
    secp256k1_fe_verify((secp256k1_fe *)psVar279);
    a = psVar279;
    if (0x20 < local_220 + local_2e8._40_4_) goto LAB_0010c044;
    local_2e8._0_8_ = local_2e8._0_8_ + local_278._48_8_;
    local_2e8._8_8_ = local_2e8._8_8_ + uStack_240;
    local_2e8._16_8_ = (long)((secp256k1_fe *)local_2e8._16_8_)->n + local_238;
    local_2e8._24_8_ = (long)((secp256k1_fe *)local_2e8._24_8_)->n + uStack_230;
    local_2e8._32_8_ = (long)((secp256k1_fe *)local_2e8._32_8_)->n + (long)(local_228->x).n;
    local_2e8._44_4_ = 0;
    local_2e8._40_4_ = local_220 + local_2e8._40_4_;
    psStack_310 = (secp256k1_gej *)0x10af13;
    in_RCX = local_228;
    secp256k1_fe_verify((secp256k1_fe *)local_2e8);
    r = (secp256k1_gej *)(local_188 + 0x30);
    local_138 = (secp256k1_gej *)local_218._80_8_;
    uStack_130 = local_218._88_8_;
    local_148 = local_218._64_8_;
    psStack_140 = (secp256k1_ge *)local_218._72_8_;
    local_188._48_8_ = local_218._48_8_;
    uStack_150 = local_218._56_8_;
    psStack_310 = (secp256k1_gej *)0x10af46;
    secp256k1_fe_verify((secp256k1_fe *)r);
    b = (secp256k1_ge *)(local_128 + 0x30);
    psStack_310 = (secp256k1_gej *)0x10af56;
    psVar273 = (secp256k1_gej *)b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (0x20 < local_d0 + (int)uStack_130) goto LAB_0010c049;
    local_2e8._48_8_ = local_188._48_8_ + local_128._48_8_;
    local_2e8._56_8_ = uStack_150 + uStack_f0;
    local_2e8._64_8_ = local_148 + local_e8;
    local_2e8._72_8_ = (long)(psStack_140->x).n + uStack_e0;
    a = (secp256k1_gej *)((long)(local_138->x).n + local_d8);
    uStack_130 = (ulong)(uint)(local_d0 + (int)uStack_130);
    psStack_310 = (secp256k1_gej *)0x10afbd;
    local_188._48_8_ = local_2e8._48_8_;
    uStack_150 = local_2e8._56_8_;
    local_148 = local_2e8._64_8_;
    psStack_140 = (secp256k1_ge *)local_2e8._72_8_;
    local_138 = a;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    r = (secp256k1_gej *)local_2e8;
    psStack_310 = (secp256k1_gej *)0x10afca;
    psVar273 = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psVar281 = (secp256k1_ge *)local_2e8._24_8_;
    psVar279 = (secp256k1_gej *)local_2e8._16_8_;
    if (8 < (int)local_2e8._40_4_) goto LAB_0010c04e;
    unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_2e8._0_8_ * 2;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_2e8._24_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_2e8._8_8_ * 2;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = local_2e8._16_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_2e8._32_8_;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = local_2e8._32_8_;
    uVar270 = SUB168(auVar24 * auVar140,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar23 * auVar139 + auVar22 * auVar138 + auVar25 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    local_128._0_8_ = uVar277 & 0xfffffffffffff;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    b = (secp256k1_ge *)(local_2e8._32_8_ * 2);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_2e8._0_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = b;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_2e8._8_8_ * 2;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = local_2e8._24_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_2e8._16_8_;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = local_2e8._16_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar270 >> 0x34 | SUB168(auVar24 * auVar140,8) << 0xc;
    auVar2 = auVar26 * auVar141 + auVar225 + auVar27 * auVar142 + auVar28 * auVar143 +
             auVar29 * ZEXT816(0x1000003d10);
    uVar270 = auVar2._0_8_;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    local_278._0_8_ = (uVar270 & 0xfffffffffffff) >> 0x30;
    a_00 = (secp256k1_gej *)(uVar270 & 0xffffffffffff);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_2e8._0_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = local_2e8._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_2e8._8_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = b;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_2e8._16_8_ * 2;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = local_2e8._24_8_;
    auVar2 = auVar31 * auVar145 + auVar226 + auVar32 * auVar146;
    uVar270 = auVar2._0_8_;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = (uVar270 & 0xfffffffffffff) << 4 | local_278._0_8_;
    auVar2 = auVar30 * auVar144 + ZEXT816(0x1000003d1) * auVar147;
    uVar270 = auVar2._0_8_;
    local_c8.y.n[0] = uVar270 & 0xfffffffffffff;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_2e8._0_8_ * 2;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = local_2e8._8_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_2e8._16_8_;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = b;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_2e8._24_8_;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = local_2e8._24_8_;
    auVar3 = auVar34 * auVar149 + auVar228 + auVar35 * auVar150;
    uVar270 = auVar3._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar33 * auVar148 + auVar227 + auVar36 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = uVar270 >> 0x34 | auVar3._8_8_ << 0xc;
    local_c8.y.n[1] = uVar277 & 0xfffffffffffff;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_2e8._0_8_ * 2;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_2e8._16_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_2e8._8_8_;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = local_2e8._8_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_2e8._24_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = b;
    auVar230 = auVar39 * auVar153 + auVar230;
    uVar270 = auVar230._0_8_;
    in_RCX = auVar230._8_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar37 * auVar151 + auVar229 + auVar38 * auVar152 + auVar40 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    local_c8.y.n[2] = uVar277 & 0xfffffffffffff;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = (uVar277 >> 0x34 | auVar2._8_8_ << 0xc) + local_128._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar270 >> 0x34 | (long)in_RCX << 0xc;
    auVar231 = auVar41 * ZEXT816(0x1000003d10) + auVar231;
    uVar270 = auVar231._0_8_;
    in_R9 = auVar231._8_8_;
    local_c8.y.n[3] = uVar270 & 0xfffffffffffff;
    in_R8 = (secp256k1_ge *)((long)(a_00->x).n + (uVar270 >> 0x34 | in_R9 << 0xc));
    local_c8.y.magnitude = 1;
    local_c8.y.normalized = 0;
    psStack_310 = (secp256k1_gej *)0x10b228;
    local_2e8._80_8_ = unaff_R12;
    local_218._0_8_ = a_00;
    local_c8.y.n[4] = (uint64_t)in_R8;
    secp256k1_fe_verify(&local_c8.y);
    r = (secp256k1_gej *)(local_278 + 0x30);
    psStack_310 = (secp256k1_gej *)0x10b238;
    psVar273 = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (1 < local_220) goto LAB_0010c053;
    local_c8.x.n[0] = 0x3ffffbfffff0bc - local_278._48_8_;
    local_c8.x.n[1] = 0x3ffffffffffffc - uStack_240;
    local_c8.x.n[2] = 0x3ffffffffffffc - local_238;
    local_c8.x.n[3] = 0x3ffffffffffffc - uStack_230;
    local_c8.x.n[4] = 0x3fffffffffffc - (long)local_228;
    local_c8.x.magnitude = 2;
    local_c8.x.normalized = 0;
    psStack_310 = (secp256k1_gej *)0x10b29b;
    secp256k1_fe_verify(&local_c8.x);
    b = (secp256k1_ge *)local_128;
    a_00 = (secp256k1_gej *)(local_218 + 0x60);
    psStack_310 = (secp256k1_gej *)0x10b2b6;
    secp256k1_fe_mul((secp256k1_fe *)b,(secp256k1_fe *)a_00,&local_c8.x);
    r = (secp256k1_gej *)&local_c8.y;
    psStack_310 = (secp256k1_gej *)0x10b2c6;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psStack_310 = (secp256k1_gej *)0x10b2ce;
    psVar273 = (secp256k1_gej *)b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (0x20 < local_128._40_4_ + local_c8.y.magnitude) goto LAB_0010c058;
    local_c8.y.n[0] = local_c8.y.n[0] + local_128._0_8_;
    local_c8.y.n[1] = local_c8.y.n[1] + local_128._8_8_;
    local_c8.y.n[2] = local_c8.y.n[2] + local_128._16_8_;
    local_c8.y.n[3] = local_c8.y.n[3] + local_128._24_8_;
    local_c8.y.n[4] = (long)((secp256k1_fe *)local_c8.y.n[4])->n + local_128._32_8_;
    local_c8.y.normalized = 0;
    local_c8.y.magnitude = local_128._40_4_ + local_c8.y.magnitude;
    psStack_310 = (secp256k1_gej *)0x10b32f;
    secp256k1_fe_verify(&local_c8.y);
    psStack_310 = (secp256k1_gej *)0x10b33c;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    in_R8 = (secp256k1_ge *)0x1000003d1;
    lVar271 = ((ulong)a >> 0x30) * 0x1000003d1;
    uVar277 = local_2e8._48_8_ + lVar271;
    uVar270 = local_2e8._56_8_ + (uVar277 >> 0x34);
    uVar275 = local_2e8._64_8_ + (uVar270 >> 0x34);
    psVar279 = (secp256k1_gej *)0x1000003d0;
    uVar272 = (long)((secp256k1_fe *)local_2e8._72_8_)->n + (uVar275 >> 0x34);
    uVar274 = (uVar272 >> 0x34) + ((ulong)a & 0xffffffffffff);
    a_00 = (secp256k1_gej *)
           ((uVar277 ^ 0x1000003d0) & uVar270 & uVar275 & uVar272 & (uVar274 ^ 0xf000000000000));
    in_RCX = (secp256k1_ge *)((uVar270 | uVar277 | uVar275 | uVar272) & 0xfffffffffffff | uVar274);
    bVar282 = in_RCX == (secp256k1_ge *)0x0;
    a = (secp256k1_gej *)CONCAT71((int7)((ulong)lVar271 >> 8),bVar282);
    bVar283 = a_00 == (secp256k1_gej *)0xfffffffffffff;
    unaff_R15 = (secp256k1_gej *)CONCAT71(0xfffffffffff,bVar283);
    r = (secp256k1_gej *)local_188;
    local_188._32_8_ = local_218._80_8_;
    local_188._40_8_ = local_218._88_8_;
    local_188._16_8_ = local_218._64_8_;
    local_188._24_8_ = local_218._72_8_;
    local_188._0_8_ = local_218._48_8_;
    local_188._8_8_ = local_218._56_8_;
    psStack_310 = (secp256k1_gej *)0x10b420;
    psVar273 = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (0x10 < (int)local_188._40_4_) goto LAB_0010c05d;
    local_188._0_8_ = local_188._0_8_ * 2;
    local_188._8_8_ = local_188._8_8_ * 2;
    local_188._16_8_ = local_188._16_8_ * 2;
    local_188._24_8_ = local_188._24_8_ * 2;
    local_188._32_8_ = local_188._32_8_ << 1;
    local_188._44_4_ = 0;
    local_188._40_4_ = local_188._40_4_ * 2;
    psStack_310 = (secp256k1_gej *)0x10b463;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    r = &local_c8;
    psStack_310 = (secp256k1_gej *)0x10b473;
    secp256k1_fe_verify(&r->x);
    b = (secp256k1_ge *)(local_218 + 0x60);
    psStack_310 = (secp256k1_gej *)0x10b483;
    psVar273 = (secp256k1_gej *)b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (0x20 < (int)uStack_190 + local_c8.x.magnitude) goto LAB_0010c062;
    r = &local_c8;
    local_c8.x.n[0] = local_c8.x.n[0] + local_218._96_8_;
    local_c8.x.n[1] = local_c8.x.n[1] + uStack_1b0;
    local_c8.x.n[2] = (long)((secp256k1_fe *)local_c8.x.n[2])->n + (long)(local_1a8->x).n;
    local_c8.x.n[3] = (long)((secp256k1_fe *)local_c8.x.n[3])->n + (long)(psStack_1a0->x).n;
    local_c8.x.n[4] = (long)(local_198->x).n + local_c8.x.n[4];
    bVar282 = bVar282 || bVar283;
    b = (secp256k1_ge *)(ulong)bVar282;
    local_c8.x.normalized = 0;
    local_c8.x.magnitude = (int)uStack_190 + local_c8.x.magnitude;
    psStack_310 = (secp256k1_gej *)0x10b4e4;
    in_RCX = local_198;
    secp256k1_fe_verify(&r->x);
    uVar267 = local_2e8._64_8_;
    local_2e8._65_3_ = 0;
    local_2e8[0x40] = bVar282;
    uVar266 = local_2e8._64_4_;
    flag = bVar282 ^ 1;
    a = (secp256k1_gej *)(ulong)flag;
    psStack_310 = (secp256k1_gej *)0x10b501;
    local_2e8._64_8_ = uVar267;
    secp256k1_fe_cmov((secp256k1_fe *)local_188,&local_c8.y,flag);
    a_00 = (secp256k1_gej *)(local_188 + 0x30);
    psStack_310 = (secp256k1_gej *)0x10b513;
    secp256k1_fe_cmov(&r->x,(secp256k1_fe *)a_00,flag);
    psStack_310 = (secp256k1_gej *)0x10b51b;
    psVar273 = r;
    secp256k1_fe_verify(&r->x);
    psVar280 = (secp256k1_ge *)local_c8.x.n[3];
    psVar278 = (secp256k1_gej *)local_c8.x.n[2];
    if (8 < local_c8.x.magnitude) goto LAB_0010c067;
    local_2e8._64_8_ = CONCAT44(local_2e8._68_4_,uVar266);
    local_2e8._48_8_ = 0x1000003d0;
    unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_c8.x.n[0] * 2;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = local_c8.x.n[3];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_c8.x.n[1] * 2;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = local_c8.x.n[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_c8.x.n[4];
    auVar156._8_8_ = 0;
    auVar156._0_8_ = local_c8.x.n[4];
    uVar270 = SUB168(auVar44 * auVar156,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar43 * auVar155 + auVar42 * auVar154 + auVar45 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    local_278._0_8_ = uVar277 & 0xfffffffffffff;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    b = (secp256k1_ge *)(local_c8.x.n[4] * 2);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_c8.x.n[0];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = b;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_c8.x.n[1] * 2;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = local_c8.x.n[3];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_c8.x.n[2];
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_c8.x.n[2];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar270 >> 0x34 | SUB168(auVar44 * auVar156,8) << 0xc;
    auVar2 = auVar46 * auVar157 + auVar232 + auVar47 * auVar158 + auVar48 * auVar159 +
             auVar49 * ZEXT816(0x1000003d10);
    uVar270 = auVar2._0_8_;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    local_2f8 = (uVar270 & 0xfffffffffffff) >> 0x30;
    a_00 = (secp256k1_gej *)(uVar270 & 0xffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_c8.x.n[0];
    auVar160._8_8_ = 0;
    auVar160._0_8_ = local_c8.x.n[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_c8.x.n[1];
    auVar161._8_8_ = 0;
    auVar161._0_8_ = b;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_c8.x.n[2] * 2;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = local_c8.x.n[3];
    auVar2 = auVar51 * auVar161 + auVar233 + auVar52 * auVar162;
    uVar270 = auVar2._0_8_;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = (uVar270 & 0xfffffffffffff) << 4 | local_2f8;
    auVar2 = auVar50 * auVar160 + ZEXT816(0x1000003d1) * auVar163;
    uVar270 = auVar2._0_8_;
    local_218._0_8_ = uVar270 & 0xfffffffffffff;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_c8.x.n[0] * 2;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = local_c8.x.n[1];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_c8.x.n[2];
    auVar165._8_8_ = 0;
    auVar165._0_8_ = b;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_c8.x.n[3];
    auVar166._8_8_ = 0;
    auVar166._0_8_ = local_c8.x.n[3];
    auVar3 = auVar54 * auVar165 + auVar235 + auVar55 * auVar166;
    uVar270 = auVar3._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar53 * auVar164 + auVar234 + auVar56 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar270 >> 0x34 | auVar3._8_8_ << 0xc;
    local_218._8_8_ = uVar277 & 0xfffffffffffff;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_c8.x.n[0] * 2;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = local_c8.x.n[2];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_c8.x.n[1];
    auVar168._8_8_ = 0;
    auVar168._0_8_ = local_c8.x.n[1];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_c8.x.n[3];
    auVar169._8_8_ = 0;
    auVar169._0_8_ = b;
    auVar237 = auVar59 * auVar169 + auVar237;
    uVar270 = auVar237._0_8_;
    in_RCX = auVar237._8_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar57 * auVar167 + auVar236 + auVar58 * auVar168 + auVar60 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    local_218._16_8_ = uVar277 & 0xfffffffffffff;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = (uVar277 >> 0x34 | auVar2._8_8_ << 0xc) + local_278._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar270 >> 0x34 | (long)in_RCX << 0xc;
    auVar238 = auVar61 * ZEXT816(0x1000003d10) + auVar238;
    uVar270 = auVar238._0_8_;
    in_R9 = auVar238._8_8_;
    local_218._24_8_ = uVar270 & 0xfffffffffffff;
    in_R8 = (secp256k1_ge *)((long)(a_00->x).n + (uVar270 >> 0x34 | in_R9 << 0xc));
    local_218._40_4_ = 1;
    local_218._44_4_ = 0;
    psStack_310 = (secp256k1_gej *)0x10b772;
    local_2f0 = a_00;
    local_218._32_8_ = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)local_218);
    r = (secp256k1_gej *)local_2e8;
    psStack_310 = (secp256k1_gej *)0x10b77f;
    psVar273 = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (2 < (int)local_2e8._40_4_) goto LAB_0010c06c;
    local_278._0_8_ = 0x5ffff9ffffe91a - local_2e8._0_8_;
    local_278._8_8_ = 0x5ffffffffffffa - local_2e8._8_8_;
    r = (secp256k1_gej *)local_278;
    local_278._16_8_ = 0x5ffffffffffffa - local_2e8._16_8_;
    local_278._24_8_ = 0x5ffffffffffffa - local_2e8._24_8_;
    local_278._32_8_ = 0x5fffffffffffa - local_2e8._32_8_;
    local_278._40_4_ = 3;
    local_278._44_4_ = 0;
    psStack_310 = (secp256k1_gej *)0x10b7d9;
    secp256k1_fe_verify((secp256k1_fe *)r);
    a = (secp256k1_gej *)local_218;
    psStack_310 = (secp256k1_gej *)0x10b7ef;
    a_00 = r;
    secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,(secp256k1_fe *)a);
    psStack_310 = (secp256k1_gej *)0x10b7f7;
    psVar273 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    uVar267 = local_218._24_8_;
    psVar279 = (secp256k1_gej *)local_218._16_8_;
    if (8 < (int)local_218._40_4_) goto LAB_0010c071;
    unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_218._0_8_ * 2;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = local_218._24_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_218._8_8_ * 2;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = local_218._16_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_218._32_8_;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = local_218._32_8_;
    uVar270 = SUB168(auVar64 * auVar172,0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar63 * auVar171 + auVar62 * auVar170 + auVar65 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    local_2f0 = (secp256k1_gej *)(uVar277 & 0xfffffffffffff);
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    b = (secp256k1_ge *)(local_218._32_8_ * 2);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_218._0_8_;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = b;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_218._8_8_ * 2;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = local_218._24_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_218._16_8_;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = local_218._16_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar270 >> 0x34 | SUB168(auVar64 * auVar172,8) << 0xc;
    auVar2 = auVar66 * auVar173 + auVar239 + auVar67 * auVar174 + auVar68 * auVar175 +
             auVar69 * ZEXT816(0x1000003d10);
    local_2f8 = auVar2._0_8_;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = local_2f8 >> 0x34 | auVar2._8_8_ << 0xc;
    local_280 = (local_2f8 & 0xfffffffffffff) >> 0x30;
    local_2f8 = local_2f8 & 0xffffffffffff;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_218._0_8_;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = local_218._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_218._8_8_;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = b;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_218._16_8_ * 2;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_218._24_8_;
    auVar2 = auVar71 * auVar177 + auVar240 + auVar72 * auVar178;
    uVar270 = auVar2._0_8_;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = (uVar270 & 0xfffffffffffff) << 4 | local_280;
    auVar2 = auVar70 * auVar176 + ZEXT816(0x1000003d1) * auVar179;
    uVar277 = auVar2._0_8_;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_218._0_8_ * 2;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = local_218._8_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_218._16_8_;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = b;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_218._24_8_;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_218._24_8_;
    auVar3 = auVar74 * auVar181 + auVar242 + auVar75 * auVar182;
    uVar270 = auVar3._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar73 * auVar180 + auVar241 + auVar76 * ZEXT816(0x1000003d10);
    uVar272 = auVar2._0_8_;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar270 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar272 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_218._0_8_ * 2;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = local_218._16_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_218._8_8_;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = local_218._8_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_218._24_8_;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = b;
    auVar244 = auVar79 * auVar185 + auVar244;
    uVar270 = auVar244._0_8_;
    in_RCX = auVar244._8_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar77 * auVar183 + auVar243 + auVar78 * auVar184 + auVar80 * ZEXT816(0x1000003d10);
    uVar274 = auVar2._0_8_;
    local_218._16_8_ = uVar274 & 0xfffffffffffff;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = (long)(local_2f0->x).n + (uVar274 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar270 >> 0x34 | (long)in_RCX << 0xc;
    auVar245 = auVar81 * ZEXT816(0x1000003d10) + auVar245;
    uVar270 = auVar245._0_8_;
    in_R9 = auVar245._8_8_;
    local_218._24_8_ = uVar270 & 0xfffffffffffff;
    in_R8 = (secp256k1_ge *)((uVar270 >> 0x34 | in_R9 << 0xc) + local_2f8);
    local_218._40_4_ = 1;
    local_218._44_4_ = 0;
    psStack_310 = (secp256k1_gej *)0x10ba43;
    local_218._0_8_ = (secp256k1_gej *)(uVar277 & 0xfffffffffffff);
    local_218._8_8_ = uVar272 & 0xfffffffffffff;
    local_218._32_8_ = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)a);
    a_00 = (secp256k1_gej *)(local_188 + 0x30);
    psStack_310 = (secp256k1_gej *)0x10ba57;
    secp256k1_fe_cmov((secp256k1_fe *)a,(secp256k1_fe *)a_00,local_2e8._64_4_);
    r = (secp256k1_gej *)local_188;
    psStack_310 = (secp256k1_gej *)0x10ba67;
    psVar273 = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psVar281 = (secp256k1_ge *)local_188._24_8_;
    psVar280 = (secp256k1_ge *)uVar267;
    if (8 < (int)local_188._40_4_) goto LAB_0010c076;
    a = (secp256k1_gej *)local_2e8;
    unaff_R15 = (secp256k1_gej *)0xfffffffffffff;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_188._0_8_ * 2;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = local_188._24_8_;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = local_188._8_8_ * 2;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = local_188._16_8_;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = local_188._32_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = local_188._32_8_;
    uVar277 = SUB168(auVar84 * auVar188,0);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar277 & 0xfffffffffffff;
    auVar2 = auVar83 * auVar187 + auVar82 * auVar186 + auVar85 * ZEXT816(0x1000003d10);
    uVar270 = auVar2._0_8_;
    local_2f0 = (secp256k1_gej *)(uVar270 & 0xfffffffffffff);
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar270 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar270 = local_188._32_8_ * 2;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = local_188._0_8_;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar270;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = local_188._8_8_ * 2;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = local_188._24_8_;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = local_188._16_8_;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = local_188._16_8_;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar277 >> 0x34 | SUB168(auVar84 * auVar188,8) << 0xc;
    auVar2 = auVar86 * auVar189 + auVar246 + auVar87 * auVar190 + auVar88 * auVar191 +
             auVar89 * ZEXT816(0x1000003d10);
    local_2f8 = auVar2._0_8_;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = local_2f8 >> 0x34 | auVar2._8_8_ << 0xc;
    local_280 = (local_2f8 & 0xfffffffffffff) >> 0x30;
    local_2f8 = local_2f8 & 0xffffffffffff;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = local_188._0_8_;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = local_188._0_8_;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = local_188._8_8_;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar270;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = local_188._16_8_ * 2;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = local_188._24_8_;
    auVar2 = auVar91 * auVar193 + auVar247 + auVar92 * auVar194;
    uVar277 = auVar2._0_8_;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = (uVar277 & 0xfffffffffffff) << 4 | local_280;
    auVar2 = auVar90 * auVar192 + ZEXT816(0x1000003d1) * auVar195;
    uVar277 = auVar2._0_8_;
    local_2e8._0_8_ = uVar277 & 0xfffffffffffff;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar277 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_188._0_8_ * 2;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = local_188._8_8_;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = local_188._16_8_;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar270;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = local_188._24_8_;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = local_188._24_8_;
    auVar3 = auVar94 * auVar197 + auVar249 + auVar95 * auVar198;
    uVar277 = auVar3._0_8_;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar277 & 0xfffffffffffff;
    auVar2 = auVar93 * auVar196 + auVar248 + auVar96 * ZEXT816(0x1000003d10);
    uVar272 = auVar2._0_8_;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar277 >> 0x34 | auVar3._8_8_ << 0xc;
    local_2e8._8_8_ = uVar272 & 0xfffffffffffff;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar272 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = local_188._0_8_ * 2;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = local_188._16_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = local_188._8_8_;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = local_188._8_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = local_188._24_8_;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar270;
    auVar251 = auVar99 * auVar201 + auVar251;
    uVar270 = auVar251._0_8_;
    in_RCX = auVar251._8_8_;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar97 * auVar199 + auVar250 + auVar98 * auVar200 + auVar100 * ZEXT816(0x1000003d10);
    uVar277 = auVar2._0_8_;
    local_2e8._16_8_ = uVar277 & 0xfffffffffffff;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = (long)(local_2f0->x).n + (uVar277 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar270 >> 0x34 | (long)in_RCX << 0xc;
    auVar252 = auVar101 * ZEXT816(0x1000003d10) + auVar252;
    uVar270 = auVar252._0_8_;
    in_R9 = auVar252._8_8_;
    local_2e8._24_8_ = uVar270 & 0xfffffffffffff;
    in_R8 = (secp256k1_ge *)((uVar270 >> 0x34 | in_R9 << 0xc) + local_2f8);
    local_2e8._40_8_ = 1;
    psStack_310 = (secp256k1_gej *)0x10bcb4;
    local_2e8._32_8_ = in_R8;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psVar279 = local_288;
    r = (secp256k1_gej *)&local_288->z;
    psStack_310 = (secp256k1_gej *)0x10bcd6;
    a_00 = local_300;
    secp256k1_fe_mul((secp256k1_fe *)r,&local_300->x,&local_c8.x);
    psStack_310 = (secp256k1_gej *)0x10bcde;
    secp256k1_fe_verify((secp256k1_fe *)a);
    b = (secp256k1_ge *)local_278;
    psStack_310 = (secp256k1_gej *)0x10bcee;
    psVar273 = (secp256k1_gej *)b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (0x20 < (int)(local_278._40_4_ + local_2e8._40_4_)) goto LAB_0010c07b;
    b = (secp256k1_ge *)local_2e8;
    local_2e8._0_8_ = local_2e8._0_8_ + local_278._0_8_;
    local_2e8._8_8_ = local_2e8._8_8_ + local_278._8_8_;
    local_2e8._16_8_ = (long)((secp256k1_fe *)local_2e8._16_8_)->n + local_278._16_8_;
    local_2e8._24_8_ = (long)((secp256k1_fe *)local_2e8._24_8_)->n + local_278._24_8_;
    local_2e8._32_8_ =
         (long)((secp256k1_fe *)local_2e8._32_8_)->n + (long)((secp256k1_fe *)local_278._32_8_)->n;
    local_2e8._44_4_ = 0;
    local_2e8._40_4_ = local_278._40_4_ + local_2e8._40_4_;
    psStack_310 = (secp256k1_gej *)0x10bd4b;
    in_RCX = (secp256k1_ge *)local_278._32_8_;
    secp256k1_fe_verify((secp256k1_fe *)b);
    (psVar279->x).n[4] = local_2e8._32_8_;
    (psVar279->x).magnitude = local_2e8._40_4_;
    (psVar279->x).normalized = local_2e8._44_4_;
    (psVar279->x).n[2] = local_2e8._16_8_;
    (psVar279->x).n[3] = local_2e8._24_8_;
    (psVar279->x).n[0] = local_2e8._0_8_;
    (psVar279->x).n[1] = local_2e8._8_8_;
    psStack_310 = (secp256k1_gej *)0x10bd72;
    psVar273 = (secp256k1_gej *)b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (0x10 < (int)local_2e8._40_4_) goto LAB_0010c080;
    b = (secp256k1_ge *)local_2e8;
    local_2e8._0_8_ = local_2e8._0_8_ * 2;
    local_2e8._8_8_ = local_2e8._8_8_ * 2;
    local_2e8._16_8_ = local_2e8._16_8_ * 2;
    local_2e8._24_8_ = local_2e8._24_8_ * 2;
    local_2e8._32_8_ = local_2e8._32_8_ << 1;
    local_2e8._44_4_ = 0;
    local_2e8._40_4_ = local_2e8._40_4_ * 2;
    psStack_310 = (secp256k1_gej *)0x10bdbc;
    secp256k1_fe_verify((secp256k1_fe *)b);
    psStack_310 = (secp256k1_gej *)0x10bdc4;
    secp256k1_fe_verify((secp256k1_fe *)b);
    unaff_R15 = (secp256k1_gej *)local_278;
    psStack_310 = (secp256k1_gej *)0x10bdd4;
    psVar273 = unaff_R15;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    if (0x20 < (int)(local_278._40_4_ + local_2e8._40_4_)) goto LAB_0010c085;
    b = (secp256k1_ge *)local_2e8;
    local_2e8._0_8_ = local_2e8._0_8_ + local_278._0_8_;
    local_2e8._8_8_ = local_2e8._8_8_ + local_278._8_8_;
    local_2e8._16_8_ = (long)((secp256k1_fe *)local_2e8._16_8_)->n + local_278._16_8_;
    local_2e8._24_8_ = (long)((secp256k1_fe *)local_2e8._24_8_)->n + local_278._24_8_;
    local_2e8._32_8_ =
         (long)((secp256k1_fe *)local_2e8._32_8_)->n + (long)((secp256k1_fe *)local_278._32_8_)->n;
    local_2e8._44_4_ = 0;
    local_2e8._40_4_ = local_278._40_4_ + local_2e8._40_4_;
    psStack_310 = (secp256k1_gej *)0x10be32;
    in_RCX = (secp256k1_ge *)local_278._32_8_;
    secp256k1_fe_verify((secp256k1_fe *)b);
    psStack_310 = (secp256k1_gej *)0x10be45;
    a_00 = (secp256k1_gej *)b;
    secp256k1_fe_mul((secp256k1_fe *)b,(secp256k1_fe *)b,(secp256k1_fe *)local_188);
    psStack_310 = (secp256k1_gej *)0x10be4d;
    secp256k1_fe_verify((secp256k1_fe *)b);
    unaff_R15 = (secp256k1_gej *)local_218;
    psStack_310 = (secp256k1_gej *)0x10be5d;
    psVar273 = unaff_R15;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    if ((int)(local_218._40_4_ + local_2e8._40_4_) < 0x21) {
      b = (secp256k1_ge *)local_2e8;
      local_2e8._0_8_ = (long)((secp256k1_fe *)local_218._0_8_)->n + local_2e8._0_8_;
      local_2e8._8_8_ = local_2e8._8_8_ + local_218._8_8_;
      local_2e8._16_8_ =
           (long)((secp256k1_fe *)local_2e8._16_8_)->n + (long)((secp256k1_fe *)local_218._16_8_)->n
      ;
      local_2e8._24_8_ =
           (long)((secp256k1_fe *)local_2e8._24_8_)->n + (long)((secp256k1_fe *)local_218._24_8_)->n
      ;
      local_2e8._32_8_ =
           (long)((secp256k1_fe *)local_2e8._32_8_)->n + (long)((secp256k1_fe *)local_218._32_8_)->n
      ;
      local_2e8._44_4_ = 0;
      local_2e8._40_4_ = local_218._40_4_ + local_2e8._40_4_;
      psStack_310 = (secp256k1_gej *)0x10bebb;
      in_RCX = (secp256k1_ge *)local_218._32_8_;
      secp256k1_fe_verify((secp256k1_fe *)b);
      psStack_310 = (secp256k1_gej *)0x10bec3;
      psVar273 = (secp256k1_gej *)b;
      secp256k1_fe_verify((secp256k1_fe *)b);
      if ((int)local_2e8._40_4_ < 4) {
        psVar1 = &psVar279->y;
        (psVar279->y).n[0] = 0x7ffff7ffffe178 - local_2e8._0_8_;
        (psVar279->y).n[1] = 0x7ffffffffffff8 - local_2e8._8_8_;
        (psVar279->y).n[2] = 0x7ffffffffffff8 - local_2e8._16_8_;
        (psVar279->y).n[3] = 0x7ffffffffffff8 - local_2e8._24_8_;
        (psVar279->y).n[4] = 0x7fffffffffff8 - local_2e8._32_8_;
        (psVar279->y).magnitude = 4;
        (psVar279->y).normalized = 0;
        psStack_310 = (secp256k1_gej *)0x10bf22;
        secp256k1_fe_verify(psVar1);
        psStack_310 = (secp256k1_gej *)0x10bf2a;
        secp256k1_fe_half(psVar1);
        uVar267 = local_2e8._88_8_;
        psStack_310 = (secp256k1_gej *)0x10bf42;
        secp256k1_fe_cmov(&psVar279->x,&local_308->x,*(int *)(local_2e8._88_8_ + 0x90));
        psStack_310 = (secp256k1_gej *)0x10bf56;
        secp256k1_fe_cmov(psVar1,(secp256k1_fe *)local_2e8._80_8_,*(int *)(uVar267 + 0x90));
        psStack_310 = (secp256k1_gej *)0x10bf6c;
        secp256k1_fe_cmov((secp256k1_fe *)r,&secp256k1_fe_one,*(int *)(uVar267 + 0x90));
        psStack_310 = (secp256k1_gej *)0x10bf74;
        secp256k1_fe_verify((secp256k1_fe *)r);
        uVar270 = (psVar279->z).n[4];
        uVar272 = (uVar270 >> 0x30) * 0x1000003d1 + (psVar279->z).n[0];
        uVar277 = (uVar272 >> 0x34) + (psVar279->z).n[1];
        uVar274 = (uVar277 >> 0x34) + (psVar279->z).n[2];
        uVar275 = (uVar274 >> 0x34) + (psVar279->z).n[3];
        uVar270 = (uVar275 >> 0x34) + (uVar270 & 0xffffffffffff);
        psVar279->infinity =
             (uint)(((local_2e8._48_8_ ^ uVar272) & uVar277 & uVar274 & uVar275 &
                    (uVar270 ^ 0xf000000000000)) == 0xfffffffffffff ||
                   ((uVar277 | uVar272 | uVar274 | uVar275) & 0xfffffffffffff) == 0 && uVar270 == 0)
        ;
        psStack_310 = (secp256k1_gej *)0x10c023;
        secp256k1_gej_verify(psVar279);
        return;
      }
      goto LAB_0010c08f;
    }
  }
  else {
    psStack_310 = (secp256k1_gej *)0x10c03a;
    secp256k1_gej_add_ge_cold_1();
LAB_0010c03a:
    psStack_310 = (secp256k1_gej *)0x10c03f;
    secp256k1_gej_add_ge_cold_19();
LAB_0010c03f:
    psStack_310 = (secp256k1_gej *)0x10c044;
    secp256k1_gej_add_ge_cold_18();
LAB_0010c044:
    psStack_310 = (secp256k1_gej *)0x10c049;
    secp256k1_gej_add_ge_cold_17();
LAB_0010c049:
    psStack_310 = (secp256k1_gej *)0x10c04e;
    secp256k1_gej_add_ge_cold_16();
LAB_0010c04e:
    psVar281 = unaff_R13;
    psVar279 = unaff_R12;
    psStack_310 = (secp256k1_gej *)0x10c053;
    secp256k1_gej_add_ge_cold_15();
LAB_0010c053:
    psStack_310 = (secp256k1_gej *)0x10c058;
    secp256k1_gej_add_ge_cold_14();
LAB_0010c058:
    psStack_310 = (secp256k1_gej *)0x10c05d;
    secp256k1_gej_add_ge_cold_13();
LAB_0010c05d:
    psStack_310 = (secp256k1_gej *)0x10c062;
    secp256k1_gej_add_ge_cold_12();
LAB_0010c062:
    psStack_310 = (secp256k1_gej *)0x10c067;
    secp256k1_gej_add_ge_cold_11();
LAB_0010c067:
    psVar280 = psVar281;
    psVar278 = psVar279;
    psStack_310 = (secp256k1_gej *)0x10c06c;
    secp256k1_gej_add_ge_cold_10();
LAB_0010c06c:
    psStack_310 = (secp256k1_gej *)0x10c071;
    secp256k1_gej_add_ge_cold_9();
LAB_0010c071:
    psVar279 = psVar278;
    psStack_310 = (secp256k1_gej *)0x10c076;
    secp256k1_gej_add_ge_cold_8();
LAB_0010c076:
    psVar281 = psVar280;
    psStack_310 = (secp256k1_gej *)0x10c07b;
    secp256k1_gej_add_ge_cold_7();
LAB_0010c07b:
    psStack_310 = (secp256k1_gej *)0x10c080;
    secp256k1_gej_add_ge_cold_6();
LAB_0010c080:
    psStack_310 = (secp256k1_gej *)0x10c085;
    secp256k1_gej_add_ge_cold_5();
LAB_0010c085:
    psStack_310 = (secp256k1_gej *)0x10c08a;
    secp256k1_gej_add_ge_cold_4();
  }
  psStack_310 = (secp256k1_gej *)0x10c08f;
  secp256k1_gej_add_ge_cold_3();
LAB_0010c08f:
  psStack_310 = (secp256k1_gej *)secp256k1_ge_set_gej;
  secp256k1_gej_add_ge_cold_2();
  psStack_3c8 = (secp256k1_gej *)0x10c0b3;
  psStack_338 = r;
  psStack_330 = psVar279;
  psStack_328 = psVar281;
  psStack_320 = (secp256k1_gej *)b;
  psStack_318 = unaff_R15;
  psStack_310 = a;
  secp256k1_gej_verify(a_00);
  *(int *)(psVar273->z).n = a_00->infinity;
  psVar1 = &a_00->z;
  psStack_3c8 = (secp256k1_gej *)0x10c0cb;
  out32 = psVar1;
  secp256k1_fe_inv(psVar1,psVar1);
  psStack_3c8 = (secp256k1_gej *)0x10c0d3;
  psVar276 = psVar1;
  secp256k1_fe_verify(psVar1);
  if ((a_00->z).magnitude < 9) {
    uVar270 = psVar1->n[0];
    uVar277 = (a_00->z).n[1];
    uVar272 = (a_00->z).n[2];
    uVar274 = (a_00->z).n[3];
    uVar275 = (a_00->z).n[4];
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar270 * 2;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar274;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar277 * 2;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar272;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar275;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar275;
    uVar268 = SUB168(auVar104 * auVar204,0);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar268 & 0xfffffffffffff;
    auVar2 = auVar103 * auVar203 + auVar102 * auVar202 + auVar105 * ZEXT816(0x1000003d10);
    uVar269 = auVar2._0_8_;
    sStack_398.n[0] = uVar269 & 0xfffffffffffff;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = uVar269 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar275 = uVar275 * 2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar270;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar275;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar277 * 2;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar274;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar272;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar272;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar268 >> 0x34 | SUB168(auVar104 * auVar204,8) << 0xc;
    auVar2 = auVar106 * auVar205 + auVar253 + auVar107 * auVar206 + auVar108 * auVar207 +
             auVar109 * ZEXT816(0x1000003d10);
    uStack_3a0 = auVar2._0_8_;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uStack_3a0 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_3a8 = (uStack_3a0 & 0xfffffffffffff) >> 0x30;
    uStack_3a0 = uStack_3a0 & 0xffffffffffff;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar270;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar270;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar277;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar275;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar272 * 2;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar274;
    auVar2 = auVar111 * auVar209 + auVar254 + auVar112 * auVar210;
    uVar268 = auVar2._0_8_;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar268 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = (uVar268 & 0xfffffffffffff) << 4 | uStack_3a8;
    auVar2 = auVar110 * auVar208 + ZEXT816(0x1000003d1) * auVar211;
    uVar268 = auVar2._0_8_;
    sStack_368.n[0] = uVar268 & 0xfffffffffffff;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar268 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar270 * 2;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar277;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar272;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = uVar275;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar274;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar274;
    auVar3 = auVar114 * auVar213 + auVar256 + auVar115 * auVar214;
    uVar268 = auVar3._0_8_;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar268 & 0xfffffffffffff;
    auVar2 = auVar113 * auVar212 + auVar255 + auVar116 * ZEXT816(0x1000003d10);
    uVar269 = auVar2._0_8_;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar268 >> 0x34 | auVar3._8_8_ << 0xc;
    sStack_368.n[1] = uVar269 & 0xfffffffffffff;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar269 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar270 * 2;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar272;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar277;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar277;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar274;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = uVar275;
    auVar258 = auVar119 * auVar217 + auVar258;
    uVar270 = auVar258._0_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar270 & 0xfffffffffffff;
    auVar2 = auVar117 * auVar215 + auVar257 + auVar118 * auVar216 + auVar120 * ZEXT816(0x1000003d10)
    ;
    uVar277 = auVar2._0_8_;
    sStack_368.n[2] = uVar277 & 0xfffffffffffff;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = (uVar277 >> 0x34 | auVar2._8_8_ << 0xc) + sStack_398.n[0];
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar270 >> 0x34 | auVar258._8_8_ << 0xc;
    auVar259 = auVar121 * ZEXT816(0x1000003d10) + auVar259;
    uVar270 = auVar259._0_8_;
    sStack_368.n[3] = uVar270 & 0xfffffffffffff;
    sStack_368.n[4] = (uVar270 >> 0x34 | auVar259._8_8_ << 0xc) + uStack_3a0;
    sStack_368.magnitude = 1;
    sStack_368.normalized = 0;
    psStack_3c8 = (secp256k1_gej *)0x10c329;
    psStack_3b8 = psVar1;
    psStack_3b0 = psVar273;
    secp256k1_fe_verify(&sStack_368);
    psVar1 = psStack_3b8;
    psStack_3c8 = (secp256k1_gej *)0x10c341;
    secp256k1_fe_mul(&sStack_398,psStack_3b8,&sStack_368);
    psStack_3c8 = (secp256k1_gej *)0x10c34f;
    secp256k1_fe_mul(&a_00->x,&a_00->x,&sStack_368);
    psStack_3c8 = (secp256k1_gej *)0x10c35e;
    secp256k1_fe_mul(&a_00->y,&a_00->y,&sStack_398);
    (a_00->z).n[0] = 1;
    (a_00->z).n[1] = 0;
    (a_00->z).n[2] = 0;
    (a_00->z).n[3] = 0;
    (a_00->z).n[4] = 0;
    (a_00->z).magnitude = 1;
    (a_00->z).normalized = 1;
    psStack_3c8 = (secp256k1_gej *)0x10c386;
    secp256k1_fe_verify(psVar1);
    uVar260 = (a_00->x).n[0];
    uVar261 = (a_00->x).n[1];
    uVar262 = (a_00->x).n[2];
    uVar263 = (a_00->x).n[3];
    iVar264 = (a_00->x).magnitude;
    iVar265 = (a_00->x).normalized;
    (psStack_3b0->x).n[4] = (a_00->x).n[4];
    (psStack_3b0->x).magnitude = iVar264;
    (psStack_3b0->x).normalized = iVar265;
    (psStack_3b0->x).n[2] = uVar262;
    (psStack_3b0->x).n[3] = uVar263;
    (psStack_3b0->x).n[0] = uVar260;
    (psStack_3b0->x).n[1] = uVar261;
    uVar260 = (a_00->y).n[1];
    uVar261 = (a_00->y).n[2];
    uVar262 = (a_00->y).n[3];
    uVar263 = (a_00->y).n[4];
    iVar264 = (a_00->y).magnitude;
    iVar265 = (a_00->y).normalized;
    (psStack_3b0->y).n[0] = (a_00->y).n[0];
    (psStack_3b0->y).n[1] = uVar260;
    (psStack_3b0->y).n[2] = uVar261;
    (psStack_3b0->y).n[3] = uVar262;
    (psStack_3b0->y).n[4] = uVar263;
    (psStack_3b0->y).magnitude = iVar264;
    (psStack_3b0->y).normalized = iVar265;
    psStack_3c8 = (secp256k1_gej *)0x10c3bf;
    secp256k1_ge_verify((secp256k1_ge *)psStack_3b0);
    return;
  }
  psStack_3c8 = (secp256k1_gej *)secp256k1_tagged_sha256;
  secp256k1_ge_set_gej_cold_1();
  psStack_3e0 = psVar273;
  psStack_3d8 = psVar279;
  psStack_3d0 = psVar1;
  psStack_3c8 = unaff_R15;
  if (psVar276 == (secp256k1_fe *)0x0) {
    secp256k1_tagged_sha256_cold_4();
  }
  else if (out32 != (secp256k1_fe *)0x0) {
    if (tag == (uchar *)0x0) {
      secp256k1_tagged_sha256_cold_2();
      return;
    }
    if (in_R8 == (secp256k1_ge *)0x0) {
      secp256k1_tagged_sha256_cold_1();
      return;
    }
    secp256k1_sha256_initialize_tagged(&sStack_448,tag,(size_t)in_RCX);
    secp256k1_sha256_write(&sStack_448,(uchar *)in_R8,in_R9);
    secp256k1_sha256_finalize(&sStack_448,(uchar *)out32);
    return;
  }
  secp256k1_tagged_sha256_cold_3();
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 24 add/cmov/half/mul_int/negate/normalize_weak/normalizes_to_zero */
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int degenerate;
    secp256k1_gej_verify(a);
    secp256k1_ge_verify(b);
    VERIFY_CHECK(!b->infinity);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);

    /*  In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = -T*M^2
     *    R = T^2-U1*U2
     *    X3 = R^2+Q
     *    Y3 = -(R*(2*X3+Q)+M^4)/2
     *    Z3 = M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);        /* u1 = U1 = X1*Z2^2 (1) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);        /* s1 = S1 = Y1*Z2^3 (1) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (2) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (2) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (2) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (3) */
    /* If lambda = R/M = R/0 we have a problem (except in the "trivial"
     * case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr = Y1*Z2^3 - Y2*Z1^3 (2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);
    /* Now Ralt / Malt = lambda and is guaranteed not to be Ralt / 0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_negate(&q, &t, 2);                     /* q = -T (3) */
    secp256k1_fe_mul(&q, &q, &n);                       /* q = Q = -T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (2) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Z3 = Malt*Z (1) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2 + Q (2) */
    r->x = t;                                           /* r->x = X3 = Ralt^2 + Q (2) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*X3 (4) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*X3 + Q (5) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*X3 + Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*X3 + Q) + M^3*Malt (3) */
    secp256k1_fe_negate(&r->y, &t, 3);                  /* r->y = -(Ralt*(2*X3 + Q) + M^3*Malt) (4) */
    secp256k1_fe_half(&r->y);                           /* r->y = Y3 = -(Ralt*(2*X3 + Q) + M^3*Malt)/2 (3) */

    /* In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &secp256k1_fe_one, a->infinity);

    /* Set r->infinity if r->z is 0.
     *
     * If a->infinity is set, then r->infinity = (r->z == 0) = (1 == 0) = false,
     * which is correct because the function assumes that b is not infinity.
     *
     * Now assume !a->infinity. This implies Z = Z1 != 0.
     *
     * Case y1 = -y2:
     * In this case we could have a = -b, namely if x1 = x2.
     * We have degenerate = true, r->z = (x1 - x2) * Z.
     * Then r->infinity = ((x1 - x2)Z == 0) = (x1 == x2) = (a == -b).
     *
     * Case y1 != -y2:
     * In this case, we can't have a = -b.
     * We have degenerate = false, r->z = (y1 + y2) * Z.
     * Then r->infinity = ((y1 + y2)Z == 0) = (y1 == -y2) = false. */
    r->infinity = secp256k1_fe_normalizes_to_zero(&r->z);
    secp256k1_gej_verify(r);
}